

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxSwitchStatement::Emit(FxSwitchStatement *this,VMFunctionBuilder *build)

{
  FxExpression *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint opc;
  size_t sVar4;
  FxExpression **ppFVar5;
  CaseAddr *pCVar6;
  FxJumpStatement **ppFVar7;
  FxJumpStatement *addr;
  iterator __end1_2;
  iterator __begin1_2;
  TArray<FxJumpStatement_*,_FxJumpStatement_*> *__range1_2;
  CaseAddr *ca_1;
  iterator __end4;
  iterator __begin4;
  TArray<FxSwitchStatement::CaseAddr,_FxSwitchStatement::CaseAddr> *__range4;
  FxExpression *line;
  iterator __end1_1;
  iterator __begin1_1;
  FArgumentList *__range1_1;
  bool defaultset;
  size_t DefaultAddress;
  CaseAddr *ca;
  iterator __end1;
  iterator __begin1;
  TArray<FxSwitchStatement::CaseAddr,_FxSwitchStatement::CaseAddr> *__range1;
  ExpEmit emit;
  VMFunctionBuilder *build_local;
  FxSwitchStatement *this_local;
  
  if (this->Condition == (FxExpression *)0x0) {
    __assert_fail("Condition != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x222f,"virtual ExpEmit FxSwitchStatement::Emit(VMFunctionBuilder *)");
  }
  uVar3 = (*this->Condition->_vptr_FxExpression[9])(this->Condition,build);
  __range1._2_1_ = (char)(uVar3 >> 0x10);
  if (__range1._2_1_ != '\0') {
    __assert_fail("emit.RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x2231,"virtual ExpEmit FxSwitchStatement::Emit(VMFunctionBuilder *)");
  }
  __end1 = TArray<FxSwitchStatement::CaseAddr,_FxSwitchStatement::CaseAddr>::begin
                     (&this->CaseAddresses);
  ca = (CaseAddr *)
       TArray<FxSwitchStatement::CaseAddr,_FxSwitchStatement::CaseAddr>::end(&this->CaseAddresses);
  while (bVar1 = TIterator<FxSwitchStatement::CaseAddr>::operator!=
                           (&__end1,(TIterator<FxSwitchStatement::CaseAddr> *)&ca), bVar1) {
    pCVar6 = TIterator<FxSwitchStatement::CaseAddr>::operator*(&__end1);
    if ((pCVar6->casevalue < 0) || (0xffff < pCVar6->casevalue)) {
      if ((pCVar6->casevalue < 0) && (-0x10000 < pCVar6->casevalue)) {
        VMFunctionBuilder::Emit(build,0x43,uVar3 & 0xffff,-(short)pCVar6->casevalue);
      }
      else {
        opc = VMFunctionBuilder::GetConstantInt(build,pCVar6->casevalue);
        VMFunctionBuilder::Emit(build,0x8a,1,uVar3 & 0xffff,opc);
      }
    }
    else {
      VMFunctionBuilder::Emit(build,0x42,uVar3 & 0xffff,(VM_SHALF)pCVar6->casevalue);
    }
    sVar4 = VMFunctionBuilder::Emit(build,0x44,0);
    pCVar6->jumpaddress = sVar4;
    TIterator<FxSwitchStatement::CaseAddr>::operator++(&__end1);
  }
  sVar4 = VMFunctionBuilder::Emit(build,0x44,0);
  bVar1 = false;
  __end1_1 = TArray<FxExpression_*,_FxExpression_*>::begin
                       (&(this->Content).super_TArray<FxExpression_*,_FxExpression_*>);
  line = (FxExpression *)
         TArray<FxExpression_*,_FxExpression_*>::end
                   (&(this->Content).super_TArray<FxExpression_*,_FxExpression_*>);
  do {
    bVar2 = TIterator<FxExpression_*>::operator!=(&__end1_1,(TIterator<FxExpression_*> *)&line);
    if (!bVar2) {
      __end1_2 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::begin(&this->Breaks);
      addr = (FxJumpStatement *)TArray<FxJumpStatement_*,_FxJumpStatement_*>::end(&this->Breaks);
      while (bVar2 = TIterator<FxJumpStatement_*>::operator!=
                               (&__end1_2,(TIterator<FxJumpStatement_*> *)&addr), bVar2) {
        ppFVar7 = TIterator<FxJumpStatement_*>::operator*(&__end1_2);
        VMFunctionBuilder::BackpatchToHere(build,(*ppFVar7)->Address);
        TIterator<FxJumpStatement_*>::operator++(&__end1_2);
      }
      if (!bVar1) {
        VMFunctionBuilder::BackpatchToHere(build,sVar4);
      }
      TDeletingArray<FxExpression_*,_FxExpression_*>::DeleteAndClear(&this->Content);
      TArray<FxExpression_*,_FxExpression_*>::ShrinkToFit
                (&(this->Content).super_TArray<FxExpression_*,_FxExpression_*>);
      ExpEmit::ExpEmit((ExpEmit *)&this_local);
      return (ExpEmit)this_local;
    }
    ppFVar5 = TIterator<FxExpression_*>::operator*(&__end1_1);
    this_00 = *ppFVar5;
    if (this_00->ExprType == EFX_CaseStatement) {
      if (this_00[1]._vptr_FxExpression == (_func_int **)0x0) {
        VMFunctionBuilder::BackpatchToHere(build,sVar4);
        bVar1 = true;
      }
      else {
        __end4 = TArray<FxSwitchStatement::CaseAddr,_FxSwitchStatement::CaseAddr>::begin
                           (&this->CaseAddresses);
        ca_1 = (CaseAddr *)
               TArray<FxSwitchStatement::CaseAddr,_FxSwitchStatement::CaseAddr>::end
                         (&this->CaseAddresses);
        while (bVar2 = TIterator<FxSwitchStatement::CaseAddr>::operator!=
                                 (&__end4,(TIterator<FxSwitchStatement::CaseAddr> *)&ca_1), bVar2) {
          pCVar6 = TIterator<FxSwitchStatement::CaseAddr>::operator*(&__end4);
          if (pCVar6->casevalue == *(int *)&this_00[1].ScriptPosition.FileName.Chars) {
            VMFunctionBuilder::BackpatchToHere(build,pCVar6->jumpaddress);
            break;
          }
          TIterator<FxSwitchStatement::CaseAddr>::operator++(&__end4);
        }
      }
    }
    else {
      FxExpression::EmitStatement(this_00,build);
    }
    TIterator<FxExpression_*>::operator++(&__end1_1);
  } while( true );
}

Assistant:

ExpEmit FxSwitchStatement::Emit(VMFunctionBuilder *build)
{
	assert(Condition != nullptr);
	ExpEmit emit = Condition->Emit(build);
	assert(emit.RegType == REGT_INT);
	// todo: 
	// - sort jump table by value.
	// - optimize the switch dispatcher to run in native code instead of executing each single branch instruction on its own.
	// e.g.: build->Emit(OP_SWITCH, emit.RegNum, build->GetConstantInt(CaseAddresses.Size());
	for (auto &ca : CaseAddresses)
	{
		if (ca.casevalue >= 0 && ca.casevalue <= 0xffff)
		{
			build->Emit(OP_TEST, emit.RegNum, (VM_SHALF)ca.casevalue);
		}
		else if (ca.casevalue < 0 && ca.casevalue >= -0xffff)
		{
			build->Emit(OP_TESTN, emit.RegNum, (VM_SHALF)-ca.casevalue);
		}
		else
		{
			build->Emit(OP_EQ_K, 1, emit.RegNum, build->GetConstantInt(ca.casevalue));
		}
		ca.jumpaddress = build->Emit(OP_JMP, 0);
	}
	size_t DefaultAddress = build->Emit(OP_JMP, 0);
	bool defaultset = false;

	for (auto line : Content)
	{
		switch (line->ExprType)
		{
		case EFX_CaseStatement:
			if (static_cast<FxCaseStatement *>(line)->Condition != nullptr)
			{
				for (auto &ca : CaseAddresses)
				{
					if (ca.casevalue == static_cast<FxCaseStatement *>(line)->CaseValue)
					{
						build->BackpatchToHere(ca.jumpaddress);
						break;
					}
				}
			}
			else
			{
				build->BackpatchToHere(DefaultAddress);
				defaultset = true;
			}
			break;

		default:
			line->EmitStatement(build);
			break;
		}
	}
	for (auto addr : Breaks)
	{
		build->BackpatchToHere(addr->Address);
	}
	if (!defaultset) build->BackpatchToHere(DefaultAddress);
	Content.DeleteAndClear();
	Content.ShrinkToFit();
	return ExpEmit();
}